

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_lbd_merge2image.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char **ppcVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  _InputArray *p_Var5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  int iVar14;
  double dVar15;
  float fVar16;
  double dVar17;
  allocator local_761;
  float local_760;
  float local_75c;
  char **local_758;
  ulong local_750;
  vector<cv::Mat,_std::allocator<cv::Mat>_> planes;
  undefined8 local_730;
  _Vector_base<int,_std::allocator<int>_> local_728;
  undefined8 local_710;
  Mat colorf;
  undefined4 uStack_704;
  Mat edges;
  long local_598;
  long *local_560;
  Mat lbd;
  uint local_540;
  int local_53c;
  long local_538;
  int *local_508;
  _InputArray local_4e8;
  Mat dashMask;
  uint local_4c8;
  uint local_4c4;
  long local_4c0;
  long *local_488;
  Mat color;
  Mat src;
  long local_300;
  int *local_2d0;
  Mat dy;
  Mat dx;
  _InputArray local_1f0 [14];
  Mat sobel;
  
  if (argc < 4) {
    std::operator<<((ostream *)&std::cerr,"Missing arguments!\n");
    poVar4 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar4 = std::operator<<(poVar4,*argv);
    poVar4 = std::operator<<(poVar4," lbd_image image_to_merge result");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar14 = 1;
  }
  else {
    iVar14 = 1;
    local_75c = 0.2;
    iVar3 = 3;
    local_760 = 0.7;
    bVar13 = true;
    local_758 = argv;
    while (iVar2 = getopt(argc,local_758,"a:ds:t:"), ppcVar1 = local_758, iVar2 != -1) {
      if (iVar2 == 0x74) {
        dVar15 = atof(_optarg);
        dVar15 = (double)(float)dVar15;
        if (dVar15 <= 0.0) {
          dVar15 = 0.0;
        }
        dVar17 = 1.0;
        if (dVar15 <= 1.0) {
          dVar17 = dVar15;
        }
        local_75c = (float)dVar17;
      }
      else if (iVar2 == 100) {
        bVar13 = false;
      }
      else if (iVar2 == 0x73) {
        iVar3 = atoi(_optarg);
      }
      else if (iVar2 == 0x61) {
        dVar15 = atof(_optarg);
        local_760 = (float)dVar15;
      }
    }
    uVar10 = (ulong)(uint)argc;
    std::__cxx11::string::string((string *)&colorf,local_758[uVar10 - 3],(allocator *)&color);
    cv::imread((string *)&lbd,(int)&colorf);
    std::__cxx11::string::~string((string *)&colorf);
    if (local_538 == 0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Error reading; ");
      poVar4 = std::operator<<(poVar4,ppcVar1[uVar10 - 3]);
      std::endl<char,std::char_traits<char>>(poVar4);
      iVar14 = 1;
    }
    else {
      std::__cxx11::string::string((string *)&colorf,ppcVar1[uVar10 - 2],(allocator *)&color);
      local_750 = uVar10;
      cv::imread((string *)&src,(int)&colorf);
      std::__cxx11::string::~string((string *)&colorf);
      if (local_300 == 0) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Error reading; ");
        poVar4 = std::operator<<(poVar4,ppcVar1[local_750 - 2]);
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      else {
        if ((local_508[1] != local_2d0[1]) || (*local_508 != *local_2d0)) {
          cv::Mat::Mat(&colorf);
          _color = 0x1010000;
          local_1f0[0].sz.width = 0;
          local_1f0[0].sz.height = 0;
          local_1f0[0].flags = 0x2010000;
          local_710 = CONCAT44((int)*(undefined8 *)local_508,
                               (int)((ulong)*(undefined8 *)local_508 >> 0x20));
          local_1f0[0].obj = (string *)&colorf;
          cv::resize(0);
          _color = 0x2010000;
          cv::Mat::copyTo((_OutputArray *)&colorf);
          cv::Mat::~Mat(&colorf);
        }
        cv::Mat::Mat(&dx);
        cv::Mat::Mat(&dy);
        _colorf = 0x1010000;
        _color = 0x2010000;
        cv::Sobel((_InputArray *)&colorf,(_OutputArray *)&color,5,1,0,iVar3,1.0,0.0,4);
        _colorf = 0x1010000;
        _color = 0x2010000;
        cv::Sobel((_InputArray *)&colorf,(_OutputArray *)&color,5,0,1,iVar3,1.0,0.0,4);
        _colorf = 0x1010000;
        local_1f0[0].sz.width = 0;
        local_1f0[0].sz.height = 0;
        _color = 0x1010000;
        local_1f0[0].flags = 0x2010000;
        local_1f0[0].obj = &dx;
        cv::multiply((_InputArray *)&colorf,(_InputArray *)&color,(_OutputArray *)local_1f0,1.0,-1);
        _colorf = 0x1010000;
        _color = 0x1010000;
        local_1f0[0].sz.width = 0;
        local_1f0[0].sz.height = 0;
        local_1f0[0].flags = 0x2010000;
        local_1f0[0].obj = &dy;
        cv::multiply((_InputArray *)&colorf,(_InputArray *)&color,(_OutputArray *)local_1f0,1.0,-1);
        cv::Mat::Mat(&edges);
        cv::operator+(&colorf,&dx);
        (**(code **)(*(long *)CONCAT44(uStack_704,_colorf) + 0x18))
                  ((long *)CONCAT44(uStack_704,_colorf),&colorf,&edges,0xffffffffffffffff);
        cv::MatExpr::~MatExpr((MatExpr *)&colorf);
        _colorf = 0x1010000;
        _color = 0x2010000;
        cv::sqrt((_InputArray *)&colorf,(_OutputArray *)&color);
        cv::abs(&colorf);
        (**(code **)(*(long *)CONCAT44(uStack_704,_colorf) + 0x18))
                  ((long *)CONCAT44(uStack_704,_colorf),&colorf,&edges,0xffffffffffffffff);
        cv::MatExpr::~MatExpr((MatExpr *)&colorf);
        _colorf = 0x1010000;
        _color = 0x3010000;
        p_Var5 = (_InputArray *)cv::noArray();
        cv::normalize((_InputArray *)&colorf,(_InputOutputArray *)&color,0.0,1.0,0x20,-1,p_Var5);
        cv::Mat::Mat(&sobel);
        _colorf = 0x2010000;
        cv::Mat::convertTo((_OutputArray *)&edges,(int)&colorf,255.0,0.0);
        local_730 = CONCAT44((int)*(undefined8 *)local_508,
                             (int)((ulong)*(undefined8 *)local_508 >> 0x20));
        cv::Scalar_<double>::Scalar_((Scalar_<double> *)&colorf,1.0);
        cv::Mat::Mat(&dashMask,&local_730,5,&colorf);
        if (!bVar13) {
          uVar10 = 0;
          if ((int)local_4c4 < 1) {
            local_4c4 = 0;
          }
          uVar8 = (ulong)local_4c8;
          if ((int)local_4c8 < 1) {
            uVar8 = uVar10;
          }
          for (; uVar10 != uVar8; uVar10 = uVar10 + 1) {
            lVar6 = *local_488 * uVar10 + local_4c0;
            for (lVar9 = 0; local_4c4 != (uint)lVar9; lVar9 = lVar9 + 1) {
              fVar16 = 1.0;
              if ((((uint)lVar9 ^ (uint)uVar10) & 2) != 0) {
                fVar16 = 0.0;
              }
              *(float *)(lVar6 + lVar9 * 4) = fVar16 * *(float *)(lVar6 + lVar9 * 4);
            }
          }
        }
        _colorf = 0x1010000;
        _color = 0x1010000;
        local_1f0[0].sz.width = 0;
        local_1f0[0].sz.height = 0;
        local_1f0[0].flags = 0x2010000;
        local_1f0[0].obj = &edges;
        cv::multiply((_InputArray *)&colorf,(_InputArray *)&color,(_OutputArray *)local_1f0,1.0,-1);
        std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector(&planes,3,(allocator_type *)&colorf);
        for (lVar6 = 0; lVar6 != 0x120; lVar6 = lVar6 + 0x60) {
          _colorf = 0x2010000;
          cv::Mat::convertTo((_OutputArray *)&lbd,(int)&colorf,0.00392156862745098,0.0);
        }
        for (lVar6 = 0; uVar10 = local_750, lVar6 != 0x120; lVar6 = lVar6 + 0x60) {
          cv::operator*(1.0,&color);
          cv::operator*(0.0,(Mat *)local_1f0);
          cv::operator+((MatExpr *)&colorf,(MatExpr *)&color);
          (**(code **)(*(long *)CONCAT44(uStack_704,_colorf) + 0x18))
                    ((long *)CONCAT44(uStack_704,_colorf),(MatExpr *)&colorf,
                     planes.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar6,0xffffffffffffffff);
          cv::MatExpr::~MatExpr((MatExpr *)&colorf);
          cv::MatExpr::~MatExpr((MatExpr *)local_1f0);
          cv::MatExpr::~MatExpr((MatExpr *)&color);
        }
        uVar8 = 0;
        if (local_53c < 1) {
          local_53c = 0;
        }
        uVar7 = (ulong)local_540;
        if ((int)local_540 < 1) {
          uVar7 = uVar8;
        }
        for (; uVar8 != uVar7; uVar8 = uVar8 + 1) {
          lVar9 = **(long **)(planes.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                              super__Vector_impl_data._M_start + 0x108) * uVar8 +
                  *(long *)(planes.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                            super__Vector_impl_data._M_start + 0xd0);
          lVar6 = *local_560;
          lVar11 = **(long **)(planes.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                               super__Vector_impl_data._M_start + 0xa8) * uVar8 +
                   *(long *)(planes.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                             super__Vector_impl_data._M_start + 0x70);
          for (lVar12 = 0; local_53c != (int)lVar12; lVar12 = lVar12 + 1) {
            if (local_75c <= *(float *)(lVar6 * uVar8 + local_598 + lVar12 * 4)) {
              *(float *)(lVar9 + lVar12 * 4) =
                   *(float *)(lVar9 + lVar12 * 4) * (1.0 - local_760) + local_760;
              *(float *)(lVar11 + lVar12 * 4) =
                   *(float *)(lVar11 + lVar12 * 4) * (1.0 - local_760) + local_760;
            }
          }
        }
        cv::Mat::Mat(&colorf);
        cv::Mat::Mat(&color);
        local_1f0[0].sz.width = 0;
        local_1f0[0].sz.height = 0;
        local_4e8.sz.width = 0;
        local_4e8.sz.height = 0;
        local_1f0[0].flags = 0x1050000;
        local_1f0[0].obj = &planes;
        local_4e8.flags = 0x2010000;
        local_4e8.obj = (MatExpr *)&colorf;
        cv::merge(local_1f0,(_OutputArray *)&local_4e8);
        local_1f0[0].sz.width = 0;
        local_1f0[0].sz.height = 0;
        local_1f0[0].flags = 0x2010000;
        local_1f0[0].obj = &color;
        cv::Mat::convertTo((_OutputArray *)&colorf,(int)local_1f0,255.0,0.0);
        std::__cxx11::string::string((string *)local_1f0,local_758[uVar10 - 1],&local_761);
        local_4e8.sz.width = 0;
        local_4e8.sz.height = 0;
        local_4e8.flags = 0x1010000;
        local_728._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_728._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_728._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_4e8.obj = &color;
        cv::imwrite((string *)local_1f0,&local_4e8,(vector *)&local_728);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_728);
        std::__cxx11::string::~string((string *)local_1f0);
        cv::Mat::~Mat(&color);
        cv::Mat::~Mat(&colorf);
        std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&planes);
        cv::Mat::~Mat(&dashMask);
        cv::Mat::~Mat(&sobel);
        cv::Mat::~Mat(&edges);
        cv::Mat::~Mat(&dy);
        cv::Mat::~Mat(&dx);
        iVar14 = 0;
      }
      cv::Mat::~Mat(&src);
    }
    cv::Mat::~Mat(&lbd);
  }
  return iVar14;
}

Assistant:

int main(int argc, char * const argv[])
{
  if (argc < 4)
  {
    std::cerr << "Missing arguments!\n";
    std::cerr << "Usage: " << argv[0] << " lbd_image image_to_merge result" << std::endl;
    return EXIT_FAILURE;
  }

  float threshold = 0.2;
  int sobelSize = 3;
  int dash = 0;
  float alpha = 0.7;

  int c = 0;
  while ( (c = getopt(argc, argv, "a:ds:t:")) != -1 )
  {
    switch (c)
    {
    case 'a':
      alpha = (float)atof(optarg);
      break;

    case 'd':
      dash = 1;
      break;

    case 's':
      sobelSize = atoi(optarg);
      break;

    case 't':
      threshold = (float)atof(optarg);
      threshold = MIN(MAX(0.0, threshold), 1.0);
      break;

    default:
      break;
    }
  }

  // Read LBD image
  cv::Mat lbd = cv::imread(argv[argc-3], 0);
  if (!lbd.data)
  {
    std::cerr << "Error reading; " << argv[argc-3] << std::endl;
    return EXIT_FAILURE;
  }

  // Read src image
  cv::Mat src = cv::imread(argv[argc-2], 0);
  if (!src.data)
  {
    std::cerr << "Error reading; " << argv[argc-2] << std::endl;
    return EXIT_FAILURE;
  }

  if (lbd.size() != src.size())
  {
    cv::Mat tmp;
    cv::resize(src, tmp, lbd.size());
    tmp.copyTo(src);
  }

  // Take gradient
  cv::Mat dx, dy;
  cv::Sobel(src, dx, CV_32F, 1, 0, sobelSize);
  cv::Sobel(src, dy, CV_32F, 0, 1, sobelSize);
  cv::multiply(dx, dx, dx);
  cv::multiply(dy, dy, dy);
  cv::Mat edges;
  edges = dx + dy;
  cv::sqrt(edges, edges);
  edges = cv::abs(edges);
  cv::normalize(edges, edges, 0, 1, cv::NORM_MINMAX);

  cv::Mat sobel;
  edges.convertTo(sobel, CV_8U, 255.0);

  // Create mask if needed
  cv::Mat dashMask(lbd.size(), CV_32FC1, cv::Scalar(1.0));
  if (dash > 0)
  {
    for (int y = 0; y < dashMask.rows; ++y)
    {
      int testValue = (y/2) % 2;
      float *p_dash = dashMask.ptr<float>(y);

      for (int x = 0; x < dashMask.cols; ++x)
        *p_dash++ *= ((x/2)%2 == testValue);
    }
  }
  cv::multiply(edges, dashMask, edges);

  // Merge step
  std::vector<cv::Mat> planes(3);
  for (int i = 0; i < 3; ++i)
    lbd.convertTo(planes[i], CV_32F, 1.0/255.0);

  int width = lbd.cols;
  int height = lbd.rows;

  for (int i = 0; i < 3; ++i)
    planes[i] = 1.0*planes[i] + 0.0*edges;

  for (int y = 0; y < height; ++y)
  {
    float const *p_edges = edges.ptr<float>(y);
    float *p_blue = planes[0].ptr<float>(y);
    float *p_green = planes[1].ptr<float>(y);
    float *p_red = planes[2].ptr<float>(y);

    for (int x = 0; x < width; ++x)
    {
      if (*p_edges >= threshold)
      {
        *p_red = alpha + (1.0-alpha)*(*p_red);
        *p_green = alpha + (1.0-alpha)*(*p_green);
      }
      p_blue++;
      p_green++;
      p_red++;
      p_edges++;
    }
  }

  cv::Mat colorf, color;
  cv::merge(planes, colorf);
  colorf.convertTo(color, CV_8U, 255.0);
  
  // Done
  cv::imwrite(argv[argc-1], color);

  return EXIT_SUCCESS;
}